

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O3

string * cfd::js::api::json::JsonMappingApi::ExtractSecretEcdsaAdaptor
                   (string *__return_storage_ptr__,string *request_message)

{
  function<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
  *in_RCX;
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  local_28._8_8_ = 0;
  local_28._0_8_ = SchnorrApi::ExtractSecretEcdsaAdaptor;
  local_18._8_8_ =
       std::
       _Function_handler<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&),_cfd::js::api::SecretDataStruct_(*)(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
       ::_M_invoke;
  local_18._0_8_ =
       std::
       _Function_handler<cfd::js::api::SecretDataStruct_(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&),_cfd::js::api::SecretDataStruct_(*)(const_cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct_&)>
       ::_M_manager;
  ExecuteJsonApi<cfd::js::api::json::ExtractSecretEcdsaAdaptorRequest,cfd::js::api::json::SecretData,cfd::js::api::ExtractSecretEcdsaAdaptorRequestStruct,cfd::js::api::SecretDataStruct>
            (__return_storage_ptr__,(json *)request_message,(string *)local_28,in_RCX);
  if ((code *)local_18._0_8_ != (code *)0x0) {
    (*(code *)local_18._0_8_)(local_28,local_28,3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string JsonMappingApi::ExtractSecretEcdsaAdaptor(
    const std::string &request_message) {
  return ExecuteJsonApi<
      ExtractSecretEcdsaAdaptorRequest, SecretData,
      ExtractSecretEcdsaAdaptorRequestStruct, SecretDataStruct>(
      request_message, SchnorrApi::ExtractSecretEcdsaAdaptor);
}